

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O1

void __thiscall
Vault::Client::Client
          (Client *this,Config *config,AuthenticationStrategy *authStrategy,
          HttpErrorCallback *httpErrorCallback,ResponseErrorCallback *responseErrorCallback)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  optional<Vault::AuthenticationResponse> result;
  _Any_data local_178;
  _Manager_type local_168;
  _Invoker_type local_160;
  _Any_data local_158;
  _Manager_type local_148;
  _Invoker_type local_140;
  Port *local_138;
  Host *local_130;
  _Optional_payload_base<Vault::AuthenticationResponse> local_128;
  Config local_e0;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_001c48b0;
  this->debug_ = config->debug_;
  this->tls_ = config->tls_;
  local_130 = &this->host_;
  (this->host_).value_._M_dataplus._M_p = (pointer)&(this->host_).value_.field_2;
  pcVar1 = (config->host_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar1,pcVar1 + (config->host_).value_._M_string_length);
  local_138 = &this->port_;
  (this->port_).value_._M_dataplus._M_p = (pointer)&(this->port_).value_.field_2;
  pcVar1 = (config->port_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_138,pcVar1,pcVar1 + (config->port_).value_._M_string_length);
  (this->token_).value_._M_dataplus._M_p = (pointer)&(this->token_).value_.field_2;
  (this->token_).value_._M_string_length = 0;
  (this->token_).value_.field_2._M_local_buf[0] = '\0';
  (this->namespace_).value_._M_dataplus._M_p = (pointer)&(this->namespace_).value_.field_2;
  pcVar1 = (config->ns_).value_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->namespace_,pcVar1,pcVar1 + (config->ns_).value_._M_string_length);
  Config::Config(&local_e0,config);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_148 = (_Manager_type)0x0;
  local_140 = httpErrorCallback->_M_invoker;
  p_Var2 = (httpErrorCallback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_158._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(httpErrorCallback->super__Function_base)._M_functor;
    local_158._8_8_ =
         *(undefined8 *)((long)&(httpErrorCallback->super__Function_base)._M_functor + 8);
    (httpErrorCallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    httpErrorCallback->_M_invoker = (_Invoker_type)0x0;
    local_148 = p_Var2;
  }
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_168 = (_Manager_type)0x0;
  local_160 = responseErrorCallback->_M_invoker;
  p_Var2 = (responseErrorCallback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_178._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(responseErrorCallback->super__Function_base)._M_functor;
    local_178._8_8_ =
         *(undefined8 *)((long)&(responseErrorCallback->super__Function_base)._M_functor + 8);
    (responseErrorCallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    responseErrorCallback->_M_invoker = (_Invoker_type)0x0;
    local_168 = p_Var2;
  }
  HttpClient::HttpClient
            (&this->httpClient_,&local_e0,(HttpErrorCallback *)&local_158,
             (ResponseErrorCallback *)&local_178);
  if (local_168 != (_Manager_type)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if (local_148 != (_Manager_type)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  std::filesystem::__cxx11::path::~path(&local_e0.caBundle_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.ns_.value_._M_dataplus._M_p != &local_e0.ns_.value_.field_2) {
    operator_delete(local_e0.ns_.value_._M_dataplus._M_p,
                    local_e0.ns_.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.port_.value_._M_dataplus._M_p != &local_e0.port_.value_.field_2) {
    operator_delete(local_e0.port_.value_._M_dataplus._M_p,
                    local_e0.port_.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.host_.value_._M_dataplus._M_p != &local_e0.host_.value_.field_2) {
    operator_delete(local_e0.host_.value_._M_dataplus._M_p,
                    local_e0.host_.value_.field_2._M_allocated_capacity + 1);
  }
  this->authStrategy_ = authStrategy;
  std::filesystem::__cxx11::path::path(&this->caBundle_,&config->caBundle_);
  (*this->authStrategy_->_vptr_AuthenticationStrategy[2])(&local_128,this->authStrategy_,this);
  if (local_128._M_engaged == true) {
    std::__cxx11::string::_M_assign((string *)&this->token_);
  }
  if (local_128._M_engaged == true) {
    std::_Optional_payload_base<Vault::AuthenticationResponse>::_M_destroy(&local_128);
  }
  return;
}

Assistant:

Vault::Client::Client(Vault::Config &config,
                      AuthenticationStrategy &authStrategy,
                      HttpErrorCallback httpErrorCallback,
                      ResponseErrorCallback responseErrorCallback)
    : debug_(config.getDebug())
    , tls_(config.getTls())
    , host_(config.getHost())
    , port_(config.getPort())
    , namespace_(config.getNamespace())
    , httpClient_(HttpClient(config, std::move(httpErrorCallback),
                             std::move(responseErrorCallback)))
    , authStrategy_(authStrategy)
    , caBundle_(config.getCaBundle()) {
  if (auto result = authStrategy_.authenticate(*this)) {
    token_ = result.value().token;
  }
}